

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReFinalize.cpp
# Opt level: O0

void __thiscall wasm::ReFinalize::visitBreak(ReFinalize *this,Break *curr)

{
  bool bVar1;
  BasicType local_24;
  Type local_20;
  Type valueType;
  Break *curr_local;
  ReFinalize *this_local;
  
  valueType.id = (uintptr_t)curr;
  Break::finalize(curr);
  local_20 = getValueType(*(Expression **)(valueType.id + 0x20));
  local_24 = unreachable;
  bVar1 = wasm::Type::operator==(&local_20,&local_24);
  if (bVar1) {
    replaceUntaken(this,*(Expression **)(valueType.id + 0x20),*(Expression **)(valueType.id + 0x28))
    ;
  }
  else {
    updateBreakValueType(this,(Name)((IString *)(valueType.id + 0x10))->str,local_20);
  }
  return;
}

Assistant:

void ReFinalize::visitBreak(Break* curr) {
  curr->finalize();
  auto valueType = getValueType(curr->value);
  if (valueType == Type::unreachable) {
    replaceUntaken(curr->value, curr->condition);
  } else {
    updateBreakValueType(curr->name, valueType);
  }
}